

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

bool __thiscall duckdb::QuantileBindData::Equals(QuantileBindData *this,FunctionData *other_p)

{
  bool bVar1;
  
  if ((FunctionData)this->desc == other_p[0x38]) {
    bVar1 = std::operator==(&(this->quantiles).
                             super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>
                            ,(vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>
                              *)(other_p + 8));
    if (bVar1) {
      bVar1 = std::operator==(&(this->order).
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (other_p + 0x20));
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool QuantileBindData::Equals(const FunctionData &other_p) const {
	auto &other = other_p.Cast<QuantileBindData>();
	return desc == other.desc && quantiles == other.quantiles && order == other.order;
}